

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddMisc.c
# Opt level: O0

int Extra_bddSuppSize(DdManager *dd,DdNode *bSupp)

{
  int local_1c;
  DdNode *pDStack_18;
  int Counter;
  DdNode *bSupp_local;
  DdManager *dd_local;
  
  local_1c = 0;
  pDStack_18 = bSupp;
  while( true ) {
    if (pDStack_18 == dd->one) {
      return local_1c;
    }
    if (((ulong)pDStack_18 & 1) != 0) break;
    if ((pDStack_18->type).kids.E != (DdNode *)((ulong)dd->one ^ 1)) {
      __assert_fail("cuddE(bSupp) == b0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/extrab/extraBddMisc.c"
                    ,0x147,"int Extra_bddSuppSize(DdManager *, DdNode *)");
    }
    pDStack_18 = (pDStack_18->type).kids.T;
    local_1c = local_1c + 1;
  }
  __assert_fail("!Cudd_IsComplement(bSupp)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/extrab/extraBddMisc.c"
                ,0x146,"int Extra_bddSuppSize(DdManager *, DdNode *)");
}

Assistant:

int Extra_bddSuppSize( DdManager * dd, DdNode * bSupp )
{
    int Counter = 0;
    while ( bSupp != b1 )
    {
        assert( !Cudd_IsComplement(bSupp) );
        assert( cuddE(bSupp) == b0 );

        bSupp = cuddT(bSupp);
        Counter++;
    }
    return Counter;
}